

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultTheme.cpp
# Opt level: O1

void __thiscall gui::DefaultTheme::DefaultTheme(DefaultTheme *this,Gui *gui,string *fontFile)

{
  bool bVar1;
  Font *this_00;
  runtime_error *this_01;
  long *plVar2;
  long *plVar3;
  float fVar4;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Theme::Theme(&this->super_Theme,gui);
  (this->super_Theme)._vptr_Theme = (_func_int **)&PTR__DefaultTheme_0027c7b8;
  this_00 = (Font *)operator_new(0x98);
  sf::Font::Font(this_00);
  (this->font_)._M_t.super___uniq_ptr_impl<sf::Font,_void_(*)(sf::Font_*)>._M_t.
  super__Tuple_impl<0UL,_sf::Font_*,_void_(*)(sf::Font_*)>.
  super__Tuple_impl<1UL,_void_(*)(sf::Font_*)>.super__Head_base<1UL,_void_(*)(sf::Font_*),_false>.
  _M_head_impl = DefaultTheme(gui::Gui_const&,std::__cxx11::string_const&)::$_0::__invoke(sf::Font__
  ;
  (this->font_)._M_t.super___uniq_ptr_impl<sf::Font,_void_(*)(sf::Font_*)>._M_t.
  super__Tuple_impl<0UL,_sf::Font_*,_void_(*)(sf::Font_*)>.super__Head_base<0UL,_sf::Font_*,_false>.
  _M_head_impl = this_00;
  bVar1 = sf::Font::loadFromFile(this_00,fontFile);
  if (bVar1) {
    fVar4 = Theme::computeTextMaxHeightRatio
                      (&this->super_Theme,
                       (this->font_)._M_t.super___uniq_ptr_impl<sf::Font,_void_(*)(sf::Font_*)>._M_t
                       .super__Tuple_impl<0UL,_sf::Font_*,_void_(*)(sf::Font_*)>.
                       super__Head_base<0UL,_sf::Font_*,_false>._M_head_impl);
    this->fontMaxHeightRatio_ = fVar4;
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"\"",fontFile);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  local_68 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_68 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_01,(string *)&local_68);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DefaultTheme::DefaultTheme(const Gui& gui, const std::string& fontFile) :
    Theme(gui),
    font_(new sf::Font(), [](sf::Font* ptr) { delete ptr; }) {

    if (!font_->loadFromFile(fontFile)) {
        throw std::runtime_error("\"" + fontFile + "\": unable to load font file.");
    }
    fontMaxHeightRatio_ = computeTextMaxHeightRatio(*font_);
}